

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_exptmod_fast(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  mp_int *c;
  ulong uVar1;
  undefined8 uVar2;
  mp_digit mVar3;
  int iVar4;
  mp_digit *pmVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  mp_digit **ppmVar10;
  mp_int *b;
  int iVar11;
  mp_digit mVar12;
  ulong uVar13;
  long lVar14;
  mp_digit mp;
  mp_int t;
  uint local_18cc;
  code *local_18c8;
  int local_18b4;
  mp_int local_18a8;
  mp_int *local_1888;
  int local_187c;
  mp_digit local_1878;
  mp_int *local_1870;
  mp_int *local_1868;
  ulong local_1860;
  mp_int local_1858;
  mp_int mStack_1838;
  mp_int local_1820 [255];
  
  iVar7 = X->used;
  uVar13 = 2;
  if ((long)iVar7 != 0) {
    uVar6 = (iVar7 + -1) * 0x3c;
    uVar1 = X->dp[(long)iVar7 + -1];
    lVar14 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    uVar8 = (uVar6 + 0x40) - ((uint)lVar14 ^ 0x3f);
    if (uVar1 == 0) {
      uVar8 = uVar6;
    }
    if ((((7 < (int)uVar8) && (uVar13 = 3, 0x24 < uVar8)) && (uVar13 = 4, 0x8c < uVar8)) &&
       ((uVar13 = 5, 0x1c2 < uVar8 && (uVar13 = 6, 0x517 < uVar8)))) {
      uVar13 = (ulong)(8 - (uVar8 < 0xdca));
    }
  }
  local_1820[0].dp = (mp_digit *)calloc(1,0x100);
  if (local_1820[0].dp == (mp_digit *)0x0) {
    return -2;
  }
  local_1820[0].used = 0;
  local_1820[0].alloc = 0x20;
  local_1820[0].sign = 0;
  iVar7 = (int)uVar13 + -1;
  uVar6 = 1 << ((byte)iVar7 & 0x1f);
  uVar8 = 1 << ((byte)uVar13 & 0x1f);
  local_1888 = G;
  local_187c = redmode;
  local_1870 = X;
  local_1868 = Y;
  local_1860 = uVar13;
  if (uVar6 < uVar8) {
    uVar13 = (ulong)uVar6;
    ppmVar10 = &local_1820[uVar13 - 1].dp;
    lVar14 = 0;
    do {
      pmVar5 = (mp_digit *)calloc(1,0x100);
      *ppmVar10 = pmVar5;
      if (pmVar5 == (mp_digit *)0x0) {
        if (uVar6 < uVar6 - (int)lVar14) {
          lVar14 = -lVar14;
          ppmVar10 = &local_1820[uVar13 - 1].dp;
          do {
            if (*ppmVar10 != (mp_digit *)0x0) {
              free(*ppmVar10);
              *ppmVar10 = (mp_digit *)0x0;
              ((mp_int *)(ppmVar10 + -2))->used = 0;
              ((mp_int *)(ppmVar10 + -2))->alloc = 0;
              *(int *)(ppmVar10 + -1) = 0;
            }
            ppmVar10 = ppmVar10 + 3;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        if (local_1820[0].dp != (mp_digit *)0x0) {
          free(local_1820[0].dp);
        }
        return -2;
      }
      ((mp_int *)(ppmVar10 + -2))->used = 0;
      ((mp_int *)(ppmVar10 + -2))->alloc = 0x20;
      *(int *)(ppmVar10 + -1) = 0;
      lVar14 = lVar14 + -1;
      ppmVar10 = ppmVar10 + 3;
    } while (uVar13 - uVar8 != lVar14);
  }
  iVar11 = local_187c;
  if (local_187c == 0) {
    iVar4 = mp_montgomery_setup(P,&local_1878);
    if (iVar4 != 0) goto LAB_00108020;
    local_18c8 = mp_montgomery_reduce;
    if (P->used < 0x100) {
      local_18c8 = fast_mp_montgomery_reduce;
    }
  }
  else if (local_187c == 1) {
    local_1878 = 0x1000000000000000 - *P->dp;
    local_18c8 = mp_dr_reduce;
  }
  else {
    iVar4 = mp_reduce_2k_setup(P,&local_1878);
    if (iVar4 != 0) goto LAB_00108020;
    local_18c8 = mp_reduce_2k;
  }
  local_18a8.dp = (mp_digit *)calloc(1,0x100);
  if (local_18a8.dp == (mp_digit *)0x0) {
    iVar4 = -2;
    goto LAB_00108020;
  }
  local_18a8.used = 0;
  local_18a8.alloc = 0x20;
  local_18a8._8_8_ = local_18a8._8_8_ & 0xffffffff00000000;
  if (iVar11 == 0) {
    iVar4 = mp_montgomery_calc_normalization(&local_18a8,P);
    if (iVar4 != 0) goto LAB_00107ffb;
    iVar4 = mp_mulmod(local_1888,&local_18a8,P,local_1820);
  }
  else {
    *local_18a8.dp = 1;
    local_18a8.used = 1;
    local_18a8.alloc = 0x20;
    iVar4 = mp_mod(local_1888,P,local_1820);
  }
  if (iVar4 == 0) {
    uVar13 = (ulong)uVar6;
    b = &mStack_1838 + uVar13;
    iVar4 = mp_copy(local_1820,b);
    mVar3 = local_1878;
    if (iVar4 == 0) {
      iVar11 = 1;
      if (1 < iVar7) {
        iVar11 = iVar7;
      }
      do {
        iVar4 = s_mp_sqr(b,b);
        local_1820[uVar13 - 1].sign = 0;
        if ((iVar4 != 0) || (iVar4 = (*local_18c8)(b,P,mVar3), iVar4 != 0)) goto LAB_00107ffb;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      do {
        uVar13 = uVar13 + 1;
        if (uVar8 <= uVar13) {
          local_1888 = (mp_int *)CONCAT44(local_1888._4_4_,local_1870->used + -1);
          iVar11 = 1;
          mVar12 = 0;
          local_18cc = 0;
          local_18b4 = 0;
          iVar7 = 0;
          goto LAB_001080ea;
        }
        c = b + 1;
        iVar4 = mp_mul(b,local_1820,c);
        if (iVar4 != 0) break;
        b = b + 1;
        iVar4 = (*local_18c8)(c,P,mVar3);
      } while (iVar4 == 0);
    }
  }
  goto LAB_00107ffb;
  while (iVar7 = 1, iVar4 == 0) {
LAB_001080ea:
    do {
      iVar4 = iVar7;
      iVar7 = local_187c;
      iVar11 = iVar11 + -1;
      if (iVar11 == 0) {
        if ((int)local_1888 == -1) {
          if (local_18b4 < 1 || iVar4 != 2) goto LAB_001082d0;
          goto LAB_00108257;
        }
        lVar14 = (long)(int)local_1888;
        local_1888 = (mp_int *)CONCAT44(local_1888._4_4_,(int)local_1888 + -1);
        mVar12 = local_1870->dp[lVar14];
        iVar11 = 0x3c;
      }
      uVar9 = (uint)(mVar12 >> 0x3b) & 1;
      mVar12 = mVar12 * 2;
      iVar7 = 0;
    } while (iVar4 == 0 && uVar9 == 0);
    if ((iVar4 == 1) && (uVar9 == 0)) {
      iVar4 = s_mp_sqr(&local_18a8,&local_18a8);
      local_18a8._8_8_ = local_18a8._8_8_ & 0xffffffff00000000;
      if (iVar4 != 0) break;
      iVar4 = (*local_18c8)(&local_18a8,P,mVar3);
    }
    else {
      local_18b4 = local_18b4 + 1;
      local_18cc = local_18cc | uVar9 << ((char)local_1860 - (char)local_18b4 & 0x1fU);
      uVar13 = local_1860 & 0xffffffff;
      iVar7 = 2;
      if ((int)local_1860 != local_18b4) goto LAB_001080ea;
      do {
        iVar4 = s_mp_sqr(&local_18a8,&local_18a8);
        local_18a8._8_8_ = local_18a8._8_8_ & 0xffffffff00000000;
        if ((iVar4 != 0) || (iVar4 = (*local_18c8)(&local_18a8,P,mVar3), iVar4 != 0))
        goto LAB_00107ffb;
        uVar9 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar9;
      } while (uVar9 != 0);
      iVar4 = mp_mul(&local_18a8,&mStack_1838 + (int)local_18cc,&local_18a8);
      if (iVar4 != 0) break;
      iVar4 = (*local_18c8)(&local_18a8,P,mVar3);
      local_18cc = 0;
      local_18b4 = 0;
    }
  }
  goto LAB_00107ffb;
  while (local_18b4 = local_18b4 + -1, local_18b4 != 0) {
LAB_00108257:
    iVar4 = s_mp_sqr(&local_18a8,&local_18a8);
    local_18a8._8_8_ = local_18a8._8_8_ & 0xffffffff00000000;
    if (((iVar4 != 0) || (iVar4 = (*local_18c8)(&local_18a8,P,mVar3), iVar4 != 0)) ||
       ((local_18cc = local_18cc * 2, (local_18cc & uVar8) != 0 &&
        ((iVar4 = mp_mul(&local_18a8,local_1820,&local_18a8), iVar4 != 0 ||
         (iVar4 = (*local_18c8)(&local_18a8,P,mVar3), iVar4 != 0)))))) goto LAB_00107ffb;
  }
LAB_001082d0:
  if ((iVar7 != 0) || (iVar4 = (*local_18c8)(&local_18a8,P,mVar3), iVar4 == 0)) {
    local_1858.dp = local_18a8.dp;
    local_1858.used = local_18a8.used;
    local_1858.alloc = local_18a8.alloc;
    local_1858._8_8_ = local_18a8._8_8_;
    pmVar5 = local_1868->dp;
    uVar2._0_4_ = local_1868->used;
    uVar2._4_4_ = local_1868->alloc;
    uVar13 = *(ulong *)&local_1868->sign;
    local_1868->used = local_18a8.used;
    local_1868->alloc = local_18a8.alloc;
    local_1868->sign = local_18a8.sign;
    *(undefined4 *)&local_1868->field_0xc = local_18a8._12_4_;
    local_1868->dp = local_18a8.dp;
    iVar4 = 0;
    local_18a8._0_8_ = uVar2;
    local_18a8._8_8_ = uVar13;
    local_18a8.dp = pmVar5;
  }
LAB_00107ffb:
  if (local_18a8.dp != (mp_digit *)0x0) {
    free(local_18a8.dp);
    local_18a8.dp = (mp_digit *)0x0;
    local_18a8.used = 0;
    local_18a8.alloc = 0;
    local_18a8._8_8_ = local_18a8._8_8_ & 0xffffffff00000000;
  }
LAB_00108020:
  if (local_1820[0].dp != (mp_digit *)0x0) {
    free(local_1820[0].dp);
    local_1820[0].dp = (mp_digit *)0x0;
    local_1820[0].used = 0;
    local_1820[0].alloc = 0;
    local_1820[0].sign = 0;
  }
  if (uVar6 < uVar8) {
    ppmVar10 = &local_1820[(ulong)uVar6 - 1].dp;
    lVar14 = (ulong)uVar8 - (ulong)uVar6;
    do {
      if (*ppmVar10 != (mp_digit *)0x0) {
        free(*ppmVar10);
        *ppmVar10 = (mp_digit *)0x0;
        ((mp_int *)(ppmVar10 + -2))->used = 0;
        ((mp_int *)(ppmVar10 + -2))->alloc = 0;
        *(int *)(ppmVar10 + -1) = 0;
      }
      ppmVar10 = ppmVar10 + 3;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  return iVar4;
}

Assistant:

int mp_exptmod_fast (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res;
  mp_digit buf, mp;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;

  /* use a pointer to the reduction algorithm.  This allows us to use
   * one of many reduction algorithms without modding the guts of
   * the code with if statements everywhere.
   */
  int     (*redux)(mp_int*,mp_int*,mp_digit);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err;
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* determine and setup reduction code */
  if (redmode == 0) {
     /* now setup montgomery  */
     if ((err = mp_montgomery_setup (P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }

     /* automatically pick the comba one if available (saves quite a few calls/ifs) */
     if (((P->used * 2 + 1) < MP_WARRAY) &&
          P->used < (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
        redux = fast_mp_montgomery_reduce;
     } else 
     {
        /* use slower baseline Montgomery method */
        redux = mp_montgomery_reduce;
     }
  } else if (redmode == 1) {
     /* setup DR reduction for moduli of the form B**k - b */
     mp_dr_setup(P, &mp);
     redux = mp_dr_reduce;
  } else {
     /* setup DR reduction for moduli of the form 2**k - b */
     if ((err = mp_reduce_2k_setup(P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }
     redux = mp_reduce_2k;
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_M;
  }

  /* create M table
   *

   *
   * The first half of the table is not computed though accept for M[0] and M[1]
   */

  if (redmode == 0) {
     /* now we need R mod m */
     if ((err = mp_montgomery_calc_normalization (&res, P)) != MP_OKAY) {
       goto LBL_RES;
     }

     /* now set M[1] to G * R mod m */
     if ((err = mp_mulmod (G, &res, P, &M[1])) != MP_OKAY) {
       goto LBL_RES;
     }
  } else {
     mp_set(&res, 1);
     if ((err = mp_mod(G, P, &M[1])) != MP_OKAY) {
        goto LBL_RES;
     }
  }

  /* compute the value at M[1<<(winsize-1)] by squaring M[1] (winsize-1) times */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_RES;
  }

  for (x = 0; x < (winsize - 1); x++) {
    if ((err = mp_sqr (&M[1 << (winsize - 1)], &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[1 << (winsize - 1)], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* create upper table */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[x], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits so break */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int)DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (mp_digit)(buf >> (DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* get next bit of the window */
      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  if (redmode == 0) {
     /* fixup result if Montgomery reduction is used
      * recall that any value in a Montgomery system is
      * actually multiplied by R mod n.  So we have
      * to reduce one more time to cancel out the factor
      * of R.
      */
     if ((err = redux(&res, P, mp)) != MP_OKAY) {
       goto LBL_RES;
     }
  }

  /* swap res with Y */
  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}